

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_unittest.h
# Opt level: O0

void __thiscall
google::protobuf::internal::gtest_suite_Proto3PrimitiveRepeatedWireFormatTest_::
Proto3PrimitiveRepeated<void_(proto3_arena_unittest::TestAllTypes,_proto3_arena_unittest::TestUnpackedTypes)>
::Proto3PrimitiveRepeated
          (Proto3PrimitiveRepeated<void_(proto3_arena_unittest::TestAllTypes,_proto3_arena_unittest::TestUnpackedTypes)>
           *this)

{
  Proto3PrimitiveRepeated<void_(proto3_arena_unittest::TestAllTypes,_proto3_arena_unittest::TestUnpackedTypes)>
  *this_local;
  
  Proto3PrimitiveRepeatedWireFormatTest<void_(proto3_arena_unittest::TestAllTypes,_proto3_arena_unittest::TestUnpackedTypes)>
  ::Proto3PrimitiveRepeatedWireFormatTest
            (&this->
              super_Proto3PrimitiveRepeatedWireFormatTest<void_(proto3_arena_unittest::TestAllTypes,_proto3_arena_unittest::TestUnpackedTypes)>
            );
  (this->
  super_Proto3PrimitiveRepeatedWireFormatTest<void_(proto3_arena_unittest::TestAllTypes,_proto3_arena_unittest::TestUnpackedTypes)>
  ).super_Test._vptr_Test = (_func_int **)&PTR__Proto3PrimitiveRepeated_029f7b18;
  return;
}

Assistant:

TYPED_TEST_P(Proto3PrimitiveRepeatedWireFormatTest, Proto3PrimitiveRepeated) {
  typename TestFixture::TestAllTypes packed_message;
  typename TestFixture::TestUnpackedTypes unpacked_message;
  this->TestSerialization(&packed_message, this->packedTestAllTypes_);
  this->TestParsing(&packed_message, this->packedTestAllTypes_);
  this->TestParsing(&packed_message, this->unpackedTestAllTypes_);
  this->TestSerialization(&unpacked_message, this->unpackedTestUnpackedTypes_);
  this->TestParsing(&unpacked_message, this->packedTestUnpackedTypes_);
  this->TestParsing(&unpacked_message, this->unpackedTestUnpackedTypes_);
}